

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RawFile.cpp
# Opt level: O1

void __thiscall RawFile::RawFile(RawFile *this,string *fname,int flags,int mode)

{
  int iVar1;
  long *plVar2;
  runtime_error *this_00;
  long *plVar3;
  string message;
  long *local_78;
  long local_68;
  long lStack_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28 [16];
  
  iVar1 = open((fname->_M_dataplus)._M_p,flags,(ulong)(uint)mode);
  this->fd = iVar1;
  if (-1 < iVar1) {
    return;
  }
  local_38 = local_28;
  local_30 = 0;
  local_28[0] = 0;
  std::operator+(&local_58,"RawFile::RawFile: open for ",fname);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_58);
  local_78 = (long *)*plVar2;
  plVar3 = plVar2 + 2;
  if (local_78 == plVar3) {
    local_68 = *plVar3;
    lStack_60 = plVar2[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *plVar3;
  }
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_38,(ulong)local_78);
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,(string *)&local_38);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

RawFile::RawFile(const std::string &fname, int flags, int mode) {
    fd = ::open(fname.c_str(), flags, mode);
    if (fd < 0) {
        std::string message;
        message += "RawFile::RawFile: open for " + fname + " failed";
        throw std::runtime_error(message);
    }
}